

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s2_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  pointer pfVar21;
  size_t sVar22;
  size_t sVar23;
  void *pvVar24;
  undefined1 auVar25 [16];
  uint uVar26;
  long lVar27;
  int iVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  uint uVar31;
  char *pcVar32;
  ulong uVar33;
  char *pcVar34;
  long lVar35;
  int iVar36;
  char *pcVar37;
  long lVar38;
  void *pvVar39;
  float *pfVar40;
  int iVar41;
  undefined1 in_ZMM3 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  
  auVar30 = _DAT_00316f60;
  auVar29 = _DAT_00316f40;
  iVar11 = top_blob->c;
  if (0 < (long)iVar11) {
    iVar12 = top_blob->w;
    iVar13 = top_blob->h;
    pvVar18 = _kernel->data;
    pvVar19 = _bias->data;
    iVar14 = bottom_blob->w;
    iVar28 = (iVar14 - iVar12) * 2;
    iVar15 = top_blob->dims;
    iVar16 = top_blob->h;
    pvVar20 = top_blob->data;
    lVar38 = top_blob->cstep * top_blob->elemsize;
    iVar17 = top_blob->w;
    pfVar21 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    sVar22 = bottom_blob->cstep;
    sVar23 = bottom_blob->elemsize;
    pvVar24 = bottom_blob->data;
    auVar25 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    lVar35 = 0;
    pvVar39 = pvVar20;
    do {
      iVar41 = 1;
      if (iVar15 != 3) {
        iVar41 = top_blob->d;
      }
      if (pvVar19 == (void *)0x0) {
        auVar42 = ZEXT816(0) << 0x40;
      }
      else {
        auVar42 = ZEXT416(*(uint *)((long)pvVar19 + lVar35 * 4));
      }
      fVar7 = pfVar21[lVar35];
      uVar31 = iVar41 * iVar16 * iVar17;
      if (0 < (int)uVar31) {
        auVar44._8_8_ = 0;
        auVar44._0_8_ = (ulong)uVar31 - 1;
        auVar44 = vpshufd_avx(auVar44,0x44);
        auVar42 = vshufps_avx(auVar42,auVar42,0);
        auVar43._16_16_ = auVar42;
        auVar43._0_16_ = auVar42;
        uVar33 = auVar44._0_8_;
        auVar42._0_8_ = uVar33 ^ 0x8000000000000000;
        auVar42._8_4_ = auVar44._8_4_;
        uVar26 = auVar44._12_4_;
        auVar42._12_4_ = uVar26 ^ 0x80000000;
        auVar45._0_8_ = uVar33 ^ 0x8000000000000000;
        auVar45._8_4_ = auVar42._8_4_;
        auVar45._12_4_ = uVar26 ^ 0x80000000;
        auVar46._0_8_ = uVar33 ^ 0x8000000000000000;
        auVar46._8_4_ = auVar42._8_4_;
        auVar46._12_4_ = uVar26 ^ 0x80000000;
        uVar33 = 0;
        do {
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar33;
          auVar44 = vpshufd_avx(auVar47,0x44);
          auVar49._16_16_ = auVar44;
          auVar49._0_16_ = auVar44;
          auVar50 = vorps_avx(auVar49,auVar29);
          auVar49 = vorps_avx(auVar49,auVar30);
          auVar52._0_8_ = auVar49._16_8_ ^ 0x8000000000000000;
          auVar52._8_4_ = auVar49._24_4_;
          auVar52._12_4_ = auVar49._28_4_ ^ 0x80000000;
          auVar44 = vpcmpgtq_avx(auVar52,auVar42);
          auVar48._0_8_ = auVar49._0_8_ ^ 0x8000000000000000;
          auVar48._8_4_ = auVar49._8_4_;
          auVar48._12_4_ = auVar49._12_4_ ^ 0x80000000;
          auVar47 = vpcmpgtq_avx(auVar48,auVar45);
          auVar44 = vpackssdw_avx(auVar47,auVar44);
          auVar53._0_8_ = auVar50._16_8_ ^ 0x8000000000000000;
          auVar53._8_4_ = auVar50._24_4_;
          auVar53._12_4_ = auVar50._28_4_ ^ 0x80000000;
          auVar47 = vpcmpgtq_avx(auVar53,auVar42);
          auVar51._0_8_ = auVar50._0_8_ ^ 0x8000000000000000;
          auVar51._8_4_ = auVar50._8_4_;
          auVar51._12_4_ = auVar50._12_4_ ^ 0x80000000;
          auVar48 = vpcmpgtq_avx(auVar51,auVar46);
          auVar47 = vpackssdw_avx(auVar48,auVar47);
          auVar44 = vpackssdw_avx(auVar47 ^ auVar25,auVar44 ^ auVar25);
          auVar47 = vpmovsxwd_avx(auVar44);
          auVar44 = vpunpckhwd_avx(auVar44,auVar44);
          auVar50._16_16_ = auVar44;
          auVar50._0_16_ = auVar47;
          auVar50 = vmaskmovps_avx(auVar50,auVar43);
          *(undefined1 (*) [32])((long)pvVar39 + uVar33 * 4) = auVar50;
          uVar33 = uVar33 + 8;
        } while ((uVar31 + 7 & 0xfffffff8) != uVar33);
      }
      if (0 < iVar13) {
        pfVar40 = (float *)(lVar38 * lVar35 + (long)pvVar20);
        lVar27 = lVar35 * 9;
        pcVar34 = (char *)(sVar22 * sVar23 * lVar35 + (long)pvVar24);
        pcVar32 = pcVar34 + (long)iVar14 * 2;
        pcVar37 = pcVar34 + iVar14;
        iVar41 = 0;
        do {
          iVar36 = iVar12 + 1;
          if (0 < iVar12) {
            do {
              cVar8 = *pcVar34;
              pcVar1 = pcVar34 + 1;
              pcVar2 = pcVar34 + 2;
              pcVar34 = pcVar34 + 2;
              cVar9 = *pcVar37;
              pcVar3 = pcVar37 + 1;
              pcVar4 = pcVar37 + 2;
              pcVar37 = pcVar37 + 2;
              cVar10 = *pcVar32;
              pcVar5 = pcVar32 + 1;
              pcVar6 = pcVar32 + 2;
              pcVar32 = pcVar32 + 2;
              *pfVar40 = fVar7 * (float)((int)*(char *)((long)pvVar18 + lVar27 + 8) * (int)*pcVar6 +
                                         (int)*(char *)((long)pvVar18 + lVar27 + 7) * (int)*pcVar5 +
                                        (int)*(char *)((long)pvVar18 + lVar27 + 6) * (int)cVar10 +
                                        (int)*(char *)((long)pvVar18 + lVar27 + 5) * (int)*pcVar4 +
                                        (int)*(char *)((long)pvVar18 + lVar27 + 4) * (int)*pcVar3 +
                                        (int)*(char *)((long)pvVar18 + lVar27 + 3) * (int)cVar9 +
                                        (int)*(char *)((long)pvVar18 + lVar27 + 2) * (int)*pcVar2 +
                                        (int)*(char *)((long)pvVar18 + lVar27 + 1) * (int)*pcVar1 +
                                        (int)*(char *)((long)pvVar18 + lVar27) * (int)cVar8) +
                         *pfVar40;
              pfVar40 = pfVar40 + 1;
              iVar36 = iVar36 + -1;
            } while (1 < iVar36);
          }
          pcVar34 = pcVar34 + iVar28;
          pcVar37 = pcVar37 + iVar28;
          pcVar32 = pcVar32 + iVar28;
          iVar41 = iVar41 + 1;
        } while (iVar41 != iVar13);
      }
      lVar35 = lVar35 + 1;
      pvVar39 = (void *)((long)pvVar39 + lVar38);
    } while (lVar35 != iVar11);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}